

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

TEdge * __thiscall ClipperLib::ClipperBase::AddBoundsToLML(ClipperBase *this,TEdge *e)

{
  long lVar1;
  long64 lVar2;
  TEdge *pTVar3;
  LocalMinima *newLm;
  
  pTVar3 = (TEdge *)0x0;
  do {
    while( true ) {
      e->nextInLML = pTVar3;
      e = e->next;
      if (1e-20 <= ABS(e->dx + 1e+40)) break;
      if ((e->next->ytop < e->ytop) && (e->prev->xbot < e->next->xbot)) goto LAB_0065994a;
      lVar1 = e->xtop;
      if (lVar1 != e->prev->xbot) {
        e->xcurr = lVar1;
        e->xtop = e->xbot;
        e->xbot = lVar1;
      }
      pTVar3 = e->prev;
    }
    pTVar3 = e->prev;
  } while (e->ycurr != pTVar3->ycurr);
LAB_0065994a:
  newLm = (LocalMinima *)operator_new(0x20);
  newLm->next = (LocalMinima *)0x0;
  newLm->Y = e->prev->ybot;
  if (1e-20 <= ABS(e->dx + 1e+40)) {
    pTVar3 = e->prev;
    if (pTVar3->dx <= e->dx) {
      newLm->leftBound = e;
      pTVar3 = e->prev;
      goto LAB_006599cf;
    }
  }
  else {
    if (e->xbot != e->prev->xbot) {
      lVar2 = e->xtop;
      e->xcurr = lVar2;
      e->xtop = e->xbot;
      e->xbot = lVar2;
    }
    pTVar3 = e->prev;
  }
  newLm->leftBound = pTVar3;
  pTVar3 = e;
LAB_006599cf:
  newLm->rightBound = pTVar3;
  newLm->leftBound->side = esLeft;
  newLm->rightBound->side = esRight;
  InsertLocalMinima(this,newLm);
  while( true ) {
    pTVar3 = e->next;
    if ((pTVar3->ytop == e->ytop) && (1e-20 <= ABS(pTVar3->dx + 1e+40))) break;
    e->nextInLML = pTVar3;
    e = pTVar3;
    if ((ABS(pTVar3->dx + 1e+40) < 1e-20) && (pTVar3->xbot != pTVar3->prev->xtop)) {
      lVar2 = pTVar3->xtop;
      pTVar3->xcurr = lVar2;
      pTVar3->xtop = pTVar3->xbot;
      pTVar3->xbot = lVar2;
    }
  }
  return pTVar3;
}

Assistant:

TEdge* ClipperBase::AddBoundsToLML(TEdge *e)
{
  //Starting at the top of one bound we progress to the bottom where there's
  //a local minima. We then go to the top of the next bound. These two bounds
  //form the left and right (or right and left) bounds of the local minima.
  e->nextInLML = 0;
  e = e->next;
  for (;;)
  {
    if (NEAR_EQUAL(e->dx, HORIZONTAL))
    {
      //nb: proceed through horizontals when approaching from their right,
      //    but break on horizontal minima if approaching from their left.
      //    This ensures 'local minima' are always on the left of horizontals.
      if (e->next->ytop < e->ytop && e->next->xbot > e->prev->xbot) break;
      if (e->xtop != e->prev->xbot) SwapX(*e);
      e->nextInLML = e->prev;
    }
    else if (e->ycurr == e->prev->ycurr) break;
    else e->nextInLML = e->prev;
    e = e->next;
  }

  //e and e.prev are now at a local minima ...
  LocalMinima* newLm = new LocalMinima;
  newLm->next = 0;
  newLm->Y = e->prev->ybot;

  if ( NEAR_EQUAL(e->dx, HORIZONTAL) ) //horizontal edges never start a left bound
  {
    if (e->xbot != e->prev->xbot) SwapX(*e);
    newLm->leftBound = e->prev;
    newLm->rightBound = e;
  } else if (e->dx < e->prev->dx)
  {
    newLm->leftBound = e->prev;
    newLm->rightBound = e;
  } else
  {
    newLm->leftBound = e;
    newLm->rightBound = e->prev;
  }
  newLm->leftBound->side = esLeft;
  newLm->rightBound->side = esRight;
  InsertLocalMinima( newLm );

  for (;;)
  {
    if ( e->next->ytop == e->ytop && !NEAR_EQUAL(e->next->dx, HORIZONTAL) ) break;
    e->nextInLML = e->next;
    e = e->next;
    if ( NEAR_EQUAL(e->dx, HORIZONTAL) && e->xbot != e->prev->xtop) SwapX(*e);
  }
  return e->next;
}